

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  string *no_path;
  json_uri a;
  json_uri http;
  json_uri empty;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_583;
  allocator<char> local_582;
  allocator<char> local_581;
  json_uri local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  json_uri local_4a8;
  allocator<char> local_3f0 [32];
  allocator<char> local_3d0 [32];
  json_uri local_3b0;
  json_uri local_2f8;
  json_uri local_240;
  json_uri local_188;
  json_uri local_d0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"",(allocator<char> *)&local_580);
  nlohmann::json_uri::json_uri(&local_d0,&local_4a8.urn_);
  std::__cxx11::string::~string((string *)&local_4a8);
  nlohmann::json_uri::json_uri(&local_188,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"",(allocator<char> *)&local_5a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"",(allocator<char> *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",local_3f0);
  paths(&local_188,&local_4a8.urn_,&local_580.urn_,&local_3b0.urn_);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_4a8);
  nlohmann::json_uri::~json_uri(&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"http://json-schema.org/draft-07/schema#",
             (allocator<char> *)&local_580);
  nlohmann::json_uri::json_uri(&local_3b0,&local_4a8.urn_);
  std::__cxx11::string::~string((string *)&local_4a8);
  nlohmann::json_uri::json_uri(&local_240,&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"http://json-schema.org/draft-07/schema",
             (allocator<char> *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"http://json-schema.org/draft-07",local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"http://json-schema.org",local_3d0);
  no_path = &local_5a8;
  paths(&local_240,&local_4a8.urn_,&local_580.urn_,no_path);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_4a8);
  nlohmann::json_uri::~json_uri(&local_240);
  nlohmann::json_uri::json_uri(&local_2f8,&local_3b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"http://json-schema.org/draft-07/schema",&local_581);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f0,"http://json-schema.org/draft-07",&local_582);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3d0,"http://json-schema.org",&local_583);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"#/json/path",(allocator<char> *)&local_5a8);
  nlohmann::json_uri::derive
            (&local_4a8,(EVP_PKEY_CTX *)&local_2f8,(uchar *)&local_580,(size_t *)no_path);
  std::__cxx11::string::~string((string *)&local_580);
  std::operator+(&local_580.urn_,&local_4c8," # /json/path");
  EXPECT_EQ(&local_4a8,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"#/json/special_%22",&local_5a9);
  nlohmann::json_uri::derive
            (&local_580,(EVP_PKEY_CTX *)&local_2f8,(uchar *)&local_5a8,(size_t *)no_path);
  nlohmann::json_uri::operator=(&local_4a8,&local_580);
  nlohmann::json_uri::~json_uri(&local_580);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::operator+(&local_580.urn_,&local_4c8," # /json/special_\"");
  EXPECT_EQ(&local_4a8,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"#foo",&local_5a9);
  nlohmann::json_uri::derive
            (&local_580,(EVP_PKEY_CTX *)&local_4a8,(uchar *)&local_5a8,(size_t *)no_path);
  nlohmann::json_uri::operator=(&local_4a8,&local_580);
  nlohmann::json_uri::~json_uri(&local_580);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::operator+(&local_580.urn_,&local_4c8," # foo");
  EXPECT_EQ(&local_4a8,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"#foo/looks_like_json/poiner/but/isnt",&local_5a9);
  nlohmann::json_uri::derive
            (&local_580,(EVP_PKEY_CTX *)&local_4a8,(uchar *)&local_5a8,(size_t *)no_path);
  nlohmann::json_uri::operator=(&local_4a8,&local_580);
  nlohmann::json_uri::~json_uri(&local_580);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::operator+(&local_580.urn_,&local_4c8," # foo/looks_like_json/poiner/but/isnt");
  EXPECT_EQ(&local_4a8,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"foo/looks_like_json/poiner/but/isnt",
             (allocator<char> *)&local_5a8);
  EXPECT_EQ(&local_4a8.identifier_,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_580.urn_,&local_4a8.pointer_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_5a9);
  EXPECT_EQ(&local_580.urn_,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"#/looks_like_json/poiner/and/it/is",&local_5a9);
  nlohmann::json_uri::derive
            (&local_580,(EVP_PKEY_CTX *)&local_4a8,(uchar *)&local_5a8,(size_t *)no_path);
  nlohmann::json_uri::operator=(&local_4a8,&local_580);
  nlohmann::json_uri::~json_uri(&local_580);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::operator+(&local_580.urn_,&local_4c8," # /looks_like_json/poiner/and/it/is");
  EXPECT_EQ(&local_4a8,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_580.urn_,&local_4a8.pointer_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"/looks_like_json/poiner/and/it/is",&local_5a9);
  EXPECT_EQ(&local_580.urn_,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"",(allocator<char> *)&local_5a8);
  EXPECT_EQ(&local_4a8.identifier_,&local_580.urn_);
  std::__cxx11::string::~string((string *)&local_580);
  nlohmann::json_uri::~json_uri(&local_4a8);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::~string((string *)&local_4c8);
  nlohmann::json_uri::~json_uri(&local_2f8);
  iVar1 = errors;
  nlohmann::json_uri::~json_uri(&local_3b0);
  nlohmann::json_uri::~json_uri(&local_d0);
  return iVar1;
}

Assistant:

int main(void)
{
	json_uri empty("");
	paths(empty,
	      "",
	      "",
	      "");

	json_uri http("http://json-schema.org/draft-07/schema#");
	paths(http,
	      "http://json-schema.org/draft-07/schema",
	      "http://json-schema.org/draft-07",
	      "http://json-schema.org");

	pointer_plain_name(http,
	                   "http://json-schema.org/draft-07/schema",
	                   "http://json-schema.org/draft-07",
	                   "http://json-schema.org");

	return errors;
}